

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimRecursively
          (Impl *this,int parent,int current,Prim *parentPrim,int level,
          PathIndexToSpecIndexMap *psmap,Stage *stage)

{
  pointer pNVar1;
  long lVar2;
  int iVar3;
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *pmVar4;
  bool bVar5;
  ostream *poVar6;
  size_type sVar7;
  value_type *pvVar8;
  long lVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  mapped_type *this_00;
  mapped_type *pmVar15;
  PrimMeta *pPVar16;
  mapped_type *pmVar17;
  Prim *pPVar18;
  bool bVar19;
  char *pcVar20;
  pointer piVar21;
  size_t i;
  ulong uVar22;
  int current_local;
  int parent_local;
  Impl *local_a08;
  pointer local_a00;
  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  *local_9f8;
  Prim *local_9f0;
  pointer local_9e8;
  string variantName;
  string variantSetName;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  string local_960;
  string prop_name;
  string local_920 [344];
  ostringstream ss_e;
  optional<tinyusdz::Prim> prim;
  
  current_local = current;
  parent_local = parent;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,"[USDC]");
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xcd7);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)&ss_e,"Prim hierarchy is too deep.");
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&prim);
    ::std::__cxx11::string::_M_dispose();
LAB_0016351f:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    return false;
  }
  if ((current < 0) ||
     ((int)(((long)(this->_nodes).
                   super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodes).
                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x1f8) <= current)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xce0);
    ::std::operator<<(poVar6," ");
    ::std::__cxx11::to_string(&variantName,current_local);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantSetName,"Invalid current node id: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantName);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variantSetName,". Must be in range [0, ");
    std::__cxx11::to_string
              (&local_960,
               ((long)(this->_nodes).
                      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_nodes).
                     super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1f8);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop_name
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                     &local_960);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prim,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop_name
                     ,")");
    poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&prim);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&prim);
    ::std::__cxx11::string::_M_dispose();
    goto LAB_0016351f;
  }
  prim.has_value_ = false;
  bVar19 = false;
  memset(&prim.contained,0,0x350);
  local_9f8 = &this->_variantPrims;
  sVar7 = ::std::
          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
          ::count(local_9f8,&parent_local);
  bVar5 = ReconstructPrimNode(this,parent_local,current_local,current,sVar7 != 0,psmap,stage,&prim);
  if (!bVar5) goto LAB_0016408c;
  local_9f0 = parentPrim;
  if (prim.has_value_ == true) {
    pvVar8 = nonstd::optional_lite::optional<tinyusdz::Prim>::value(&prim);
  }
  else {
    pvVar8 = (Prim *)0x0;
  }
  iVar3 = current_local;
  pNVar1 = (this->_nodes).
           super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)current_local;
  uVar22 = 0;
  do {
    lVar2 = *(long *)&pNVar1[lVar9]._children.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pNVar1[iVar3]._children.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl + 8) - lVar2 >> 3) <= uVar22) {
      sVar10 = ::std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::count(&this->_variantPropChildren,&current_local);
      pmVar4 = local_9f8;
      if (sVar10 == 0) goto LAB_00163acf;
      sVar7 = ::std::
              map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
              ::count(local_9f8,&current_local);
      pPVar18 = local_9f0;
      if (sVar7 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd1b);
        ::std::operator<<(poVar6," ");
        pcVar20 = "Internal error: variant attribute is not a child of VariantPrim.";
      }
      else if (local_9f0 == (Prim *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd1f);
        ::std::operator<<(poVar6," ");
        pcVar20 = "Internal error: parentPrim should exist.";
      }
      else {
        pmVar11 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::at(pmVar4,&current_local);
        bVar5 = is_variantElementName(&(pmVar11->_elementPath)._prim_part);
        if (bVar5) {
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::array(&toks);
          bVar5 = tokenize_variantElement(&(pmVar11->_elementPath)._prim_part,&toks);
          if (bVar5) {
            ::std::__cxx11::string::string((string *)&variantSetName,(string *)&toks);
            ::std::__cxx11::string::string((string *)&variantName,(string *)(toks._M_elems + 1));
            Variant::Variant((Variant *)&ss_e);
            pmVar12 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&this->_variantPropChildren,&current_local);
            piVar21 = (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_a00 = (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            goto LAB_0016368b;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd2e);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)&ss_e,"Invalid variant element_name.");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(this,&prop_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::~array(&toks);
          break;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd29);
        ::std::operator<<(poVar6," ");
        pcVar20 = "Corrupted Crate. VariantAttribute is not the child of VariantPrim.";
      }
      poVar6 = ::std::operator<<((ostream *)&ss_e,pcVar20);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::stringbuf::str();
      goto LAB_00164072;
    }
    bVar5 = ReconstructPrimRecursively
                      (this,current_local,*(int *)(lVar2 + uVar22 * 8),pvVar8,level + 1,psmap,stage)
    ;
    uVar22 = uVar22 + 1;
  } while (bVar5);
  goto LAB_0016408a;
LAB_0016368b:
  if (piVar21 == local_a00) goto LAB_00163983;
  sVar13 = ::std::
           map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
           ::count(&this->_variantProps,piVar21);
  if (sVar13 == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop_name);
    poVar6 = ::std::operator<<((ostream *)&prop_name,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd39);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)&prop_name,"Internal error: variant Property not found.");
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_960);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop_name);
    goto LAB_00163a99;
  }
  pmVar14 = ::std::
            map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
            ::at(&this->_variantProps,piVar21);
  ::std::__cxx11::string::string((string *)&prop_name,(string *)&(pmVar14->first)._prop_part);
  this_00 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          *)&ss_e,&prop_name);
  Property::operator=(this_00,&pmVar14->second);
  ::std::__cxx11::string::_M_dispose();
  piVar21 = piVar21 + 1;
  goto LAB_0016368b;
LAB_00163983:
  pmVar15 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
            ::operator[](&pPVar18->_variantSets,&variantSetName);
  if ((pmVar15->name)._M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)pmVar15);
  }
  pmVar17 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
            ::operator[](&pmVar15->variantSet,&variantName);
  Variant::operator=(pmVar17,(Variant *)&ss_e);
LAB_00163a99:
  Variant::~Variant((Variant *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  ::~array(&toks);
  if (piVar21 == local_a00) {
LAB_00163acf:
    local_a08 = this;
    sVar10 = ::std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::count(&this->_variantPrimChildren,&current_local);
    if (sVar10 == 0) {
LAB_00163d20:
      pmVar4 = local_9f8;
      if (parent_local == 0) {
        bVar19 = true;
        if (prim.has_value_ != true) goto LAB_0016408c;
        pPVar18 = nonstd::optional_lite::optional<tinyusdz::Prim>::value(&prim);
      }
      else {
        sVar7 = ::std::
                map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                ::count(local_9f8,&parent_local);
        if (sVar7 != 0) {
          if (prim.has_value_ == false) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar6 = ::std::operator<<((ostream *)&ss_e,"[warn]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd85);
            ::std::operator<<(poVar6," ");
            poVar6 = ::std::operator<<((ostream *)&ss_e,
                                       "parent is variantPrim, but current is not Prim.");
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::stringbuf::str();
            PushWarn(local_a08,&prop_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          }
          else {
            pmVar11 = ::std::
                      map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                      ::at(pmVar4,&parent_local);
            pvVar8 = nonstd::optional_lite::optional<tinyusdz::Prim>::value(&prim);
            ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
            emplace_back<tinyusdz::Prim>(&pmVar11->_children,pvVar8);
          }
          bVar19 = true;
          goto LAB_0016408c;
        }
        bVar19 = true;
        if (local_9f0 == (Prim *)0x0 || prim.has_value_ != true) goto LAB_0016408c;
        stage = (Stage *)&local_9f0->_children;
        pPVar18 = nonstd::optional_lite::optional<tinyusdz::Prim>::value(&prim);
      }
      bVar19 = true;
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&stage->_root_nodes,pPVar18);
      goto LAB_0016408c;
    }
    if (prim.has_value_ != false) {
      pmVar12 = ::std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::at(&this->_variantPrimChildren,&current_local);
      piVar21 = (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_9e8 = (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      do {
        pmVar4 = local_9f8;
        if (piVar21 == local_9e8) goto LAB_00163d20;
        sVar7 = ::std::
                map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                ::count(local_9f8,piVar21);
        if (sVar7 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd5b);
          ::std::operator<<(poVar6," ");
          pcVar20 = "Internal error: variant Prim children not found.";
          goto LAB_0016403e;
        }
        pmVar11 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::at(pmVar4,piVar21);
        bVar5 = is_variantElementName(&(pmVar11->_elementPath)._prim_part);
        if (!bVar5) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd64);
          ::std::operator<<(poVar6," ");
          pcVar20 = "Corrupted Crate. Variant Prim has invalid element_name.";
          goto LAB_0016403e;
        }
        ::std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 *)&prop_name);
        bVar5 = tokenize_variantElement
                          (&(pmVar11->_elementPath)._prim_part,
                           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                            *)&prop_name);
        local_a00 = (pointer)CONCAT71(local_a00._1_7_,bVar5);
        if (bVar5) {
          ::std::__cxx11::string::string((string *)&ss_e,(string *)&prop_name);
          ::std::__cxx11::string::string((string *)toks._M_elems,local_920);
          pvVar8 = nonstd::optional_lite::optional<tinyusdz::Prim>::operator->(&prim);
          pmVar15 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                    ::operator[](&pvVar8->_variantSets,(key_type *)&ss_e);
          if ((pmVar15->name)._M_string_length == 0) {
            ::std::__cxx11::string::_M_assign((string *)pmVar15);
          }
          pPVar16 = Prim::metas(pmVar11);
          pmVar17 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                    ::operator[](&pmVar15->variantSet,toks._M_elems);
          PrimMetas::operator=(&pmVar17->_metas,pPVar16);
          pmVar17 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                    ::operator[](&pmVar15->variantSet,toks._M_elems);
          std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator=
                    ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                     &pmVar17->_primChildren,
                     (vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&pmVar11->_children)
          ;
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd69);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)&ss_e,"Invalid variant element_name.");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::stringbuf::str();
          PushError(local_a08,toks._M_elems);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        }
        ::std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *)&prop_name);
        piVar21 = piVar21 + 1;
        bVar19 = false;
      } while ((char)local_a00 != '\0');
      goto LAB_0016408c;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReconstructPrimRecursively");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd52);
    ::std::operator<<(poVar6," ");
    pcVar20 = "Internal error: must be Prim.";
LAB_0016403e:
    poVar6 = ::std::operator<<((ostream *)&ss_e,pcVar20);
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::stringbuf::str();
    this = local_a08;
LAB_00164072:
    PushError(this,&prop_name);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
LAB_0016408a:
  bVar19 = false;
LAB_0016408c:
  nonstd::optional_lite::optional<tinyusdz::Prim>::~optional(&prim);
  return bVar19;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimRecursively(
    int parent, int current, Prim *parentPrim, int level,
    const PathIndexToSpecIndexMap &psmap, Stage *stage) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Prim hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  //
  // TODO: Use bottom-up reconstruction(traverse child first)
  //

  // null : parent node is Property or other Spec type.
  // non-null : parent node is Prim
  Prim *currPrimPtr = nullptr;
  nonstd::optional<Prim> prim;

  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimNode(parent, current, level, is_parent_variant, psmap,
                           stage, &prim)) {
    return false;
  }

  if (prim) {
    currPrimPtr = &(prim.value());
  }

  // Traverse children
  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimRecursively(current, int(node.GetChildren()[i]),
                                      currPrimPtr, level + 1, psmap, stage)) {
        return false;
      }
      DCOUT("DONE Reconstuct Prim children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrim) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrim should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    Variant variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.properties()[prop_name] = std::get<1>(pp);
    }

    VariantSet &vs = parentPrim->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!prim) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant Prim ", prim->element_name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrims.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const Prim &vp = _variantPrims.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.element_name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.element_name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.element_name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSet &vs = prim->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].primChildren() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (prim) {
      stage->root_prims().emplace_back(std::move(prim.value()));
    }
  } else {
    if (_variantPrims.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!prim) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        Prim &vp = _variantPrims.at(parent);
        vp.children().emplace_back(std::move(prim.value()));
      }
    } else if (prim && parentPrim) {
      // Add to parent prim.
      parentPrim->children().emplace_back(std::move(prim.value()));
    }
  }

  return true;
}